

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O3

void __thiscall bandit::reporter::xunit::it_failed(xunit *this,string *desc,assertion_exception *ex)

{
  undefined1 *puVar1;
  failure_formatter_t *pfVar2;
  ostream *poVar3;
  string local_60;
  string local_40;
  
  progress_base::it_failed(&this->super_progress_base,desc,ex);
  print_remaining_header_with_time(this);
  puVar1 = &this->field_0x80;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\t<failure message=\"",0x14);
  pfVar2 = (this->super_progress_base).failure_formatter_;
  (*pfVar2->_vptr_interface[2])(&local_40,pfVar2,ex);
  escape(&local_60,this,&local_40);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" />\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t</testcase>\n",0xd);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        progress_base::it_failed(desc, ex);
        print_remaining_header_with_time();
        work_stm_ << "\t\t<failure message=\"" << escape(failure_formatter_.format(ex)) << "\" />\n";
        work_stm_ << "\t</testcase>\n";
      }